

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O3

void Sat_MmFixedRestart(Sat_MmFixed_t *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  
  iVar2 = p->nChunks;
  if (iVar2 != 0) {
    if (iVar2 < 1) {
      __assert_fail("p->nChunks > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satMem.c"
                    ,0xf6,"void Sat_MmFixedRestart(Sat_MmFixed_t *)");
    }
    if (iVar2 != 1) {
      lVar6 = 1;
      do {
        if (p->pChunks[lVar6] != (char *)0x0) {
          free(p->pChunks[lVar6]);
          p->pChunks[lVar6] = (char *)0x0;
          iVar2 = p->nChunks;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
    p->nChunks = 1;
    pcVar5 = *p->pChunks;
    iVar2 = p->nChunkSize;
    iVar1 = p->nEntrySize;
    if (1 < iVar2) {
      iVar4 = iVar2 + -1;
      pcVar3 = pcVar5;
      do {
        pcVar5 = pcVar3 + iVar1;
        *(char **)pcVar3 = pcVar5;
        iVar4 = iVar4 + -1;
        pcVar3 = pcVar5;
      } while (iVar4 != 0);
    }
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    p->pEntriesFree = *p->pChunks;
    p->nMemoryAlloc = iVar1 * iVar2;
    p->nMemoryUsed = 0;
    p->nEntriesAlloc = iVar2;
    p->nEntriesUsed = 0;
  }
  return;
}

Assistant:

void Sat_MmFixedRestart( Sat_MmFixed_t * p )
{
    int i;
    char * pTemp;
    if ( p->nChunks == 0 )
        return;
    assert( p->nChunks > 0 );

    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks = 1;
    // transform these entries into a linked list
    pTemp = p->pChunks[0];
    for ( i = 1; i < p->nChunkSize; i++ )
    {
        *((char **)pTemp) = pTemp + p->nEntrySize;
        pTemp += p->nEntrySize;
    }
    // set the last link
    *((char **)pTemp) = NULL;
    // set the free entry list
    p->pEntriesFree  = p->pChunks[0];
    // set the correct statistics
    p->nMemoryAlloc  = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed   = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed  = 0;
}